

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coreaction.cc
# Opt level: O0

void ActionStackPtrFlow::analyzeExtraPop(Funcdata *data,AddrSpace *stackspace,int4 spcbase)

{
  int iVar1;
  int4 iVar2;
  OpCode OVar3;
  spacetype sVar4;
  Architecture *pAVar5;
  PcodeOp *this;
  Varnode *this_00;
  AddrSpace *this_01;
  Address *addr;
  PcodeOp *op_00;
  FuncCallSpecs *this_02;
  ulong uVar6;
  uintb uVar7;
  Varnode *local_300;
  int4 local_2f4;
  undefined1 local_2f0 [4];
  int4 sz;
  vector<Varnode_*,_std::allocator<Varnode_*>_> paramlist;
  int4 comp;
  int4 soln2;
  FuncCallSpecs *fc;
  PcodeOp *iop;
  Varnode *iopvn;
  PcodeOp *op;
  int4 local_28c;
  Varnode *pVStack_288;
  int4 soln;
  Varnode *vn;
  int4 i;
  bool warningprinted;
  Varnode *invn;
  ostringstream s;
  LowlevelError *err;
  undefined1 local_b8 [8];
  StackSolver solver;
  ProtoModel *myfp;
  int4 spcbase_local;
  AddrSpace *stackspace_local;
  Funcdata *data_local;
  
  pAVar5 = Funcdata::getArch(data);
  solver._136_8_ = pAVar5->evalfp_called;
  if ((ProtoModel *)solver._136_8_ == (ProtoModel *)0x0) {
    pAVar5 = Funcdata::getArch(data);
    solver._136_8_ = pAVar5->defaultfp;
  }
  iVar2 = ProtoModel::getExtraPop((ProtoModel *)solver._136_8_);
  if (iVar2 == 0x8000) {
    StackSolver::StackSolver((StackSolver *)local_b8);
    StackSolver::build((StackSolver *)local_b8,data,stackspace,spcbase);
    iVar2 = StackSolver::getNumVariables((StackSolver *)local_b8);
    if (iVar2 != 0) {
      StackSolver::solve((StackSolver *)local_b8);
      _i = StackSolver::getVariable((StackSolver *)local_b8,0);
      vn._7_1_ = 0;
      for (vn._0_4_ = 1; iVar1 = (int)vn,
          iVar2 = StackSolver::getNumVariables((StackSolver *)local_b8), iVar1 < iVar2;
          vn._0_4_ = (int)vn + 1) {
        pVStack_288 = StackSolver::getVariable((StackSolver *)local_b8,(int)vn);
        local_28c = StackSolver::getSolution((StackSolver *)local_b8,(int)vn);
        if (local_28c == 0xffff) {
          if ((vn._7_1_ & 1) == 0) {
            AddrSpace::getName_abi_cxx11_(stackspace);
            std::operator+((char *)&op,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           "Unable to track spacebase fully for ");
            Funcdata::warningHeader(data,(string *)&op);
            std::__cxx11::string::~string((string *)&op);
            vn._7_1_ = 1;
          }
        }
        else {
          this = Varnode::getDef(pVStack_288);
          OVar3 = PcodeOp::code(this);
          if (OVar3 == CPUI_INDIRECT) {
            this_00 = PcodeOp::getIn(this,1);
            this_01 = Varnode::getSpace(this_00);
            sVar4 = AddrSpace::getType(this_01);
            if (sVar4 == IPTR_IOP) {
              addr = Varnode::getAddr(this_00);
              op_00 = PcodeOp::getOpFromConst(addr);
              this_02 = Funcdata::getCallSpecs(data,op_00);
              if (this_02 != (FuncCallSpecs *)0x0) {
                paramlist.super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
                paramlist.super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage._0_4_ =
                     StackSolver::getCompanion((StackSolver *)local_b8,(int)vn);
                if (-1 < (int4)paramlist.super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage) {
                  paramlist.super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage._4_4_ =
                       StackSolver::getSolution
                                 ((StackSolver *)local_b8,
                                  (int4)paramlist.
                                        super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>.
                                        _M_impl.super__Vector_impl_data._M_end_of_storage);
                }
                FuncCallSpecs::setEffectiveExtraPop
                          (this_02,local_28c -
                                   paramlist.
                                   super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl
                                   .super__Vector_impl_data._M_end_of_storage._4_4_);
              }
            }
          }
          std::vector<Varnode_*,_std::allocator<Varnode_*>_>::vector
                    ((vector<Varnode_*,_std::allocator<Varnode_*>_> *)local_2f0);
          std::vector<Varnode_*,_std::allocator<Varnode_*>_>::push_back
                    ((vector<Varnode_*,_std::allocator<Varnode_*>_> *)local_2f0,(value_type *)&i);
          iVar2 = Varnode::getSize(_i);
          uVar6 = (ulong)local_28c;
          local_2f4 = iVar2;
          uVar7 = calc_mask(iVar2);
          local_300 = Funcdata::newConstant(data,iVar2,uVar6 & uVar7);
          std::vector<Varnode_*,_std::allocator<Varnode_*>_>::push_back
                    ((vector<Varnode_*,_std::allocator<Varnode_*>_> *)local_2f0,&local_300);
          Funcdata::opSetOpcode(data,this,CPUI_INT_ADD);
          Funcdata::opSetAllInput
                    (data,this,(vector<Varnode_*,_std::allocator<Varnode_*>_> *)local_2f0);
          std::vector<Varnode_*,_std::allocator<Varnode_*>_>::~vector
                    ((vector<Varnode_*,_std::allocator<Varnode_*>_> *)local_2f0);
        }
      }
    }
    invn._4_4_ = 1;
    StackSolver::~StackSolver((StackSolver *)local_b8);
  }
  return;
}

Assistant:

void ActionStackPtrFlow::analyzeExtraPop(Funcdata &data,AddrSpace *stackspace,int4 spcbase)

{
  ProtoModel *myfp = data.getArch()->evalfp_called;
  if (myfp == (ProtoModel *)0)
    myfp = data.getArch()->defaultfp;
  if (myfp->getExtraPop()!=ProtoModel::extrapop_unknown) return;

  StackSolver solver;
  try {
    solver.build(data,stackspace,spcbase);
  } catch(LowlevelError &err) {
    ostringstream s;
    s << "Stack frame is not setup normally: " << err.explain;
    data.warningHeader(s.str());
    return;
  }
  if (solver.getNumVariables() == 0) return;
  solver.solve();		// Solve the equations
  
  Varnode *invn = solver.getVariable(0);
  bool warningprinted = false;

  for(int4 i=1;i<solver.getNumVariables();++i) {
    Varnode *vn = solver.getVariable(i);
    int4 soln = solver.getSolution(i);
    if (soln == 65535) {
      if (!warningprinted) {
	data.warningHeader("Unable to track spacebase fully for "+stackspace->getName());
	warningprinted = true;
      }
      continue;
    }
    PcodeOp *op = vn->getDef();

    if (op->code() == CPUI_INDIRECT) {
      Varnode *iopvn = op->getIn(1);
      if (iopvn->getSpace()->getType()==IPTR_IOP) {
	PcodeOp *iop = PcodeOp::getOpFromConst(iopvn->getAddr());
	FuncCallSpecs *fc = data.getCallSpecs(iop);
	if (fc != (FuncCallSpecs *)0) {
	  int4 soln2 = 0;
	  int4 comp = solver.getCompanion(i);
	  if (comp >= 0)
	    soln2 = solver.getSolution(comp);
	  fc->setEffectiveExtraPop(soln-soln2);
	}
      }
    }
    vector<Varnode *> paramlist;
    paramlist.push_back(invn);
    int4 sz = invn->getSize();
    paramlist.push_back(data.newConstant(sz,soln&calc_mask(sz)));
    data.opSetOpcode(op,CPUI_INT_ADD);
    data.opSetAllInput(op,paramlist);
  }
  return;
}